

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void data_clear(CUPDLPdata *data)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    switch(*(undefined4 *)((long)in_RDI + 8)) {
    case 0:
      dense_clear((CUPDLPdense *)0x802c5b);
      break;
    case 1:
      csr_clear((CUPDLPcsr *)0x802c6b);
      break;
    case 2:
      csc_clear((CUPDLPcsc *)0x802c7b);
      break;
    case 3:
      csr_clear((CUPDLPcsr *)0x802c8b);
      csc_clear((CUPDLPcsc *)0x802c99);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void data_clear(CUPDLPdata *data) {
  if (data) {
    switch (data->matrix_format) {
      case DENSE:
        dense_clear(data->dense_matrix);
        break;
      case CSR:
        csr_clear(data->csr_matrix);
        break;
      case CSC:
        csc_clear(data->csc_matrix);
        break;
      case CSR_CSC:
        csr_clear(data->csr_matrix);
        csc_clear(data->csc_matrix);
        break;
    }
    cupdlp_free(data);
  }
}